

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-ws.c
# Opt level: O0

int lws_client_ws_upgrade(lws *wsi,char **cce)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  uchar *puVar5;
  bool bVar6;
  char *local_b0;
  char *pc;
  char buf [64];
  char *p;
  lws_tokenize_elem e;
  int okay;
  int len;
  int n;
  lws_tokenize ts;
  lws_context *context;
  char **cce_local;
  lws *wsi_local;
  
  ts._32_8_ = wsi->context;
  bVar1 = false;
  if ((*(ulong *)&wsi->field_0x2dc >> 0x37 & 1) != 0) {
    _lws_log(2,"%s: client ws-over-h2 upgrade not supported yet\n","lws_client_ws_upgrade");
    *cce = "HS: h2 / ws upgrade unsupported";
    return 3;
  }
  if (((wsi->http).ah)->http_response == 0x191) {
    _lws_log(2,"lws_client_handshake: got bad HTTP response \'%d\'\n",
             (ulong)((wsi->http).ah)->http_response);
    *cce = "HS: ws upgrade unauthorized";
    return 3;
  }
  if (((wsi->http).ah)->http_response != 0x65) {
    _lws_log(2,"lws_client_handshake: got bad HTTP response \'%d\'\n",
             (ulong)((wsi->http).ah)->http_response);
    *cce = "HS: ws upgrade response not 101";
    return 3;
  }
  iVar2 = lws_hdr_total_length(wsi,WSI_TOKEN_ACCEPT);
  if (iVar2 == 0) {
    _lws_log(8,"no ACCEPT\n");
    *cce = "HS: ACCEPT missing";
    return 3;
  }
  buf._56_8_ = lws_hdr_simple_ptr(wsi,WSI_TOKEN_UPGRADE);
  if ((char *)buf._56_8_ == (char *)0x0) {
    _lws_log(8,"no UPGRADE\n");
    *cce = "HS: UPGRADE missing";
    return 3;
  }
  strtolower((char *)buf._56_8_);
  iVar2 = strcmp((char *)buf._56_8_,"websocket");
  if (iVar2 != 0) {
    _lws_log(2,"lws_client_handshake: got bad Upgrade header \'%s\'\n",buf._56_8_);
    *cce = "HS: Upgrade to something other than websocket";
    return 3;
  }
  lws_tokenize_init((lws_tokenize *)&len,(char *)&pc,5);
  iVar2 = lws_hdr_copy(wsi,(char *)&pc,0x3f,WSI_TOKEN_CONNECTION);
  if (iVar2 < 1) {
LAB_0013345c:
    _lws_log(8,"%s: malfored connection \'%s\'\n","lws_client_ws_upgrade",&pc);
    *cce = "HS: UPGRADE malformed";
    return 3;
  }
  ts.token = (char *)(long)iVar2;
  do {
    p._0_4_ = lws_tokenize((lws_tokenize *)&len);
    if ((lws_tokenize_elem)p != LWS_TOKZE_DELIMITER) {
      if ((lws_tokenize_elem)p != LWS_TOKZE_TOKEN) goto LAB_0013345c;
      iVar2 = strncasecmp(ts.start,"upgrade",ts.len);
      if (iVar2 == 0) {
        p._0_4_ = LWS_TOKZE_ENDED;
      }
    }
  } while (LWS_TOKZE_ENDED < (lws_tokenize_elem)p);
  local_b0 = lws_hdr_simple_ptr(wsi,_WSI_TOKEN_CLIENT_SENT_PROTOCOLS);
  if (local_b0 == (char *)0x0) {
    _lws_log(0x20,"lws_client_int_s_hs: no protocol list\n");
  }
  else {
    _lws_log(0x20,"lws_client_int_s_hs: protocol list \'%s\'\n",local_b0);
  }
  iVar2 = lws_hdr_total_length(wsi,WSI_TOKEN_PROTOCOL);
  if (iVar2 == 0) {
    _lws_log(8,"%s: WSI_TOKEN_PROTOCOL is null\n","lws_client_ws_upgrade");
    if (wsi->protocol == (lws_protocols *)0x0) {
      okay = 0;
      wsi->protocol = wsi->vhost->protocols;
      goto LAB_00133925;
    }
    buf._56_8_ = wsi->protocol->name;
  }
  else {
    buf._56_8_ = lws_hdr_simple_ptr(wsi,WSI_TOKEN_PROTOCOL);
    sVar4 = strlen((char *)buf._56_8_);
    iVar2 = (int)sVar4;
    while( true ) {
      bVar6 = false;
      if ((local_b0 != (char *)0x0) && (bVar6 = false, *local_b0 != '\0')) {
        bVar6 = !bVar1;
      }
      if (!bVar6) break;
      iVar3 = strncmp(local_b0,(char *)buf._56_8_,(long)iVar2);
      if ((iVar3 == 0) && ((local_b0[iVar2] == ',' || (local_b0[iVar2] == '\0')))) {
        bVar1 = true;
      }
      else {
        do {
          bVar6 = false;
          if (*local_b0 != '\0') {
            bVar6 = *local_b0 != ',';
            local_b0 = local_b0 + 1;
          }
        } while (bVar6);
        for (; *local_b0 == ' '; local_b0 = local_b0 + 1) {
        }
      }
    }
    if (!bVar1) {
      _lws_log(8,"%s: got bad protocol %s\n","lws_client_ws_upgrade",buf._56_8_);
      *cce = "HS: PROTOCOL malformed";
      return 2;
    }
  }
  okay = 0;
  if ((wsi->wsistate & 0x10000000) == 0) {
    wsi->protocol = (lws_protocols *)0x0;
  }
  for (; okay < wsi->vhost->count_protocols; okay = okay + 1) {
    if ((wsi->protocol == (lws_protocols *)0x0) &&
       (iVar2 = strcmp((char *)buf._56_8_,wsi->vhost->protocols[okay].name), iVar2 == 0)) {
      wsi->protocol = wsi->vhost->protocols + okay;
      break;
    }
  }
  if (okay == wsi->vhost->count_protocols) {
    if ((wsi->wsistate & 0x10000000) == 0) {
      _lws_log(8,"%s: fail protocol %s\n","lws_client_ws_upgrade",buf._56_8_);
      *cce = "HS: Cannot match protocol";
      return 2;
    }
    okay = 0;
    while (wsi->vhost->protocols[okay].callback != (lws_callback_function *)0x0) {
      if ((wsi->protocol != (lws_protocols *)0x0) &&
         (iVar2 = strcmp(wsi->protocol->name,wsi->vhost->protocols[okay].name), iVar2 == 0)) {
        wsi->protocol = wsi->vhost->protocols + okay;
        break;
      }
      okay = okay + 1;
    }
    if (wsi->vhost->protocols[okay].callback == (lws_callback_function *)0x0) {
      if (wsi->protocol == (lws_protocols *)0x0) {
        _lws_log(1,"No protocol on client\n");
      }
      else {
        _lws_log(1,"Failed to match protocol %s\n",wsi->protocol->name);
      }
      *cce = "ws protocol no match";
      return 2;
    }
  }
  _lws_log(0x10,"Selected protocol %s\n",wsi->protocol->name);
LAB_00133925:
  lws_same_vh_protocol_insert(wsi,okay);
  buf._56_8_ = lws_hdr_simple_ptr(wsi,WSI_TOKEN_ACCEPT);
  iVar2 = strcmp((char *)buf._56_8_,((wsi->http).ah)->initial_handshake_hash_base64);
  if (iVar2 == 0) {
    iVar2 = lws_ensure_user_space(wsi);
    if (iVar2 == 0) {
      iVar2 = (*wsi->protocol->callback)
                        (wsi,LWS_CALLBACK_CLIENT_FILTER_PRE_ESTABLISH,wsi->user_space,(void *)0x0,0)
      ;
      if (iVar2 == 0) {
        lws_set_timeout(wsi,NO_PENDING_TIMEOUT,0);
        lws_header_table_detach(wsi,0);
        lws_role_transition(wsi,0x10000000,LRS_ESTABLISHED,&role_ops_ws);
        lws_validity_confirmed(wsi);
        *(ulong *)&wsi->field_0x2dc = *(ulong *)&wsi->field_0x2dc & 0xffffffffffff9fff | 0x2000;
        okay = (int)wsi->protocol->rx_buffer_size;
        if (okay == 0) {
          okay = *(int *)(ts._32_8_ + 0x4fc);
        }
        puVar5 = (uchar *)lws_realloc((void *)0x0,(long)(okay + 0x14),"client frame buffer");
        wsi->ws->rx_ubuf = puVar5;
        if (wsi->ws->rx_ubuf != (uchar *)0x0) {
          wsi->ws->rx_ubuf_alloc = okay + 0x10U;
          _lws_log(0x10,"handshake OK for protocol %s\n",wsi->protocol->name);
          iVar2 = (*wsi->protocol->callback)
                            (wsi,LWS_CALLBACK_CLIENT_ESTABLISHED,wsi->user_space,(void *)0x0,0);
          if (iVar2 != 0) {
            *cce = "HS: Rejected at CLIENT_ESTABLISHED";
            return 3;
          }
          return 0;
        }
        _lws_log(1,"Out of Mem allocating rx buffer %d\n",(ulong)(okay + 0x10U));
        *cce = "HS: OOM";
      }
      else {
        *cce = "HS: Rejected by filter cb";
      }
    }
    else {
      _lws_log(1,"Problem allocating wsi user mem\n");
      *cce = "HS: OOM";
    }
  }
  else {
    _lws_log(2,"lws_client_int_s_hs: accept \'%s\' wrong vs \'%s\'\n",buf._56_8_,
             ((wsi->http).ah)->initial_handshake_hash_base64);
    *cce = "HS: Accept hash wrong";
  }
  return 2;
}

Assistant:

int
lws_client_ws_upgrade(struct lws *wsi, const char **cce)
{
	struct lws_context *context = wsi->context;
	struct lws_tokenize ts;
	int n, len, okay = 0;
	lws_tokenize_elem e;
	char *p, buf[64];
	const char *pc;
#if !defined(LWS_WITHOUT_EXTENSIONS)
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
	char *sb = (char *)&pt->serv_buf[0];
	const struct lws_ext_options *opts;
	const struct lws_extension *ext;
	char ext_name[128];
	const char *c, *a;
	int more = 1;
	char ignore;
#endif

#if defined(LWS_WITH_DETAILED_LATENCY)
		wsi->detlat.earliest_write_req = 0;
		wsi->detlat.earliest_write_req_pre_write = 0;
#endif

	if (wsi->client_mux_substream) {/* !!! client ws-over-h2 not there yet */
		lwsl_warn("%s: client ws-over-h2 upgrade not supported yet\n",
			  __func__);
		*cce = "HS: h2 / ws upgrade unsupported";
		goto bail3;
	}

	if (wsi->http.ah->http_response == 401) {
		lwsl_warn(
		       "lws_client_handshake: got bad HTTP response '%d'\n",
		       wsi->http.ah->http_response);
		*cce = "HS: ws upgrade unauthorized";
		goto bail3;
	}

	if (wsi->http.ah->http_response != 101) {
		lwsl_warn(
		       "lws_client_handshake: got bad HTTP response '%d'\n",
		       wsi->http.ah->http_response);
		*cce = "HS: ws upgrade response not 101";
		goto bail3;
	}

	if (lws_hdr_total_length(wsi, WSI_TOKEN_ACCEPT) == 0) {
		lwsl_info("no ACCEPT\n");
		*cce = "HS: ACCEPT missing";
		goto bail3;
	}

	p = lws_hdr_simple_ptr(wsi, WSI_TOKEN_UPGRADE);
	if (!p) {
		lwsl_info("no UPGRADE\n");
		*cce = "HS: UPGRADE missing";
		goto bail3;
	}
	strtolower(p);
	if (strcmp(p, "websocket")) {
		lwsl_warn(
		      "lws_client_handshake: got bad Upgrade header '%s'\n", p);
		*cce = "HS: Upgrade to something other than websocket";
		goto bail3;
	}

	/* connection: must have "upgrade" */

	lws_tokenize_init(&ts, buf, LWS_TOKENIZE_F_COMMA_SEP_LIST |
				    LWS_TOKENIZE_F_MINUS_NONTERM);
	n = lws_hdr_copy(wsi, buf, sizeof(buf) - 1, WSI_TOKEN_CONNECTION);
	if (n <= 0) /* won't fit, or absent */
		goto bad_conn_format;
	ts.len = n;

	do {
		e = lws_tokenize(&ts);
		switch (e) {
		case LWS_TOKZE_TOKEN:
			if (!strncasecmp(ts.token, "upgrade", ts.token_len))
				e = LWS_TOKZE_ENDED;
			break;

		case LWS_TOKZE_DELIMITER:
			break;

		default: /* includes ENDED found by the tokenizer itself */
bad_conn_format:
			lwsl_info("%s: malfored connection '%s'\n",
				  __func__, buf);
			*cce = "HS: UPGRADE malformed";
			goto bail3;
		}
	} while (e > 0);

	pc = lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_SENT_PROTOCOLS);
#if defined(_DEBUG)
	if (!pc) {
		lwsl_parser("lws_client_int_s_hs: no protocol list\n");
	} else
		lwsl_parser("lws_client_int_s_hs: protocol list '%s'\n", pc);
#endif

	/*
	 * confirm the protocol the server wants to talk was in the list
	 * of protocols we offered
	 */

	len = lws_hdr_total_length(wsi, WSI_TOKEN_PROTOCOL);
	if (!len) {
		lwsl_info("%s: WSI_TOKEN_PROTOCOL is null\n", __func__);
		/*
		 * no protocol name to work from, if we don't already have one
		 * default to first protocol
		 */

		if (wsi->protocol) {
			p = (char *)wsi->protocol->name;
			goto identify_protocol;
		}

		/* no choice but to use the default protocol */

		n = 0;
		wsi->protocol = &wsi->vhost->protocols[0];
		goto check_extensions;
	}

	p = lws_hdr_simple_ptr(wsi, WSI_TOKEN_PROTOCOL);
	len = (int)strlen(p);

	while (pc && *pc && !okay) {
		if (!strncmp(pc, p, len) &&
		    (pc[len] == ',' || pc[len] == '\0')) {
			okay = 1;
			continue;
		}
		while (*pc && *pc++ != ',')
			;
		while (*pc == ' ')
			pc++;
	}

	if (!okay) {
		lwsl_info("%s: got bad protocol %s\n", __func__, p);
		*cce = "HS: PROTOCOL malformed";
		goto bail2;
	}

identify_protocol:

#if defined(LWS_WITH_HTTP_PROXY)
	lws_strncpy(wsi->ws->actual_protocol, p,
		    sizeof(wsi->ws->actual_protocol));
#endif

	/*
	 * identify the selected protocol struct and set it
	 */
	n = 0;
	/* keep client connection pre-bound protocol */
	if (!lwsi_role_client(wsi))
		wsi->protocol = NULL;

	while (n < wsi->vhost->count_protocols) {
		if (!wsi->protocol &&
		    strcmp(p, wsi->vhost->protocols[n].name) == 0) {
			wsi->protocol = &wsi->vhost->protocols[n];
			break;
		}
		n++;
	}

	if (n == wsi->vhost->count_protocols) { /* no match */
		/* if server, that's already fatal */
		if (!lwsi_role_client(wsi)) {
			lwsl_info("%s: fail protocol %s\n", __func__, p);
			*cce = "HS: Cannot match protocol";
			goto bail2;
		}

		/* for client, find the index of our pre-bound protocol */

		n = 0;
		while (wsi->vhost->protocols[n].callback) {
			if (wsi->protocol && strcmp(wsi->protocol->name,
				   wsi->vhost->protocols[n].name) == 0) {
				wsi->protocol = &wsi->vhost->protocols[n];
				break;
			}
			n++;
		}

		if (!wsi->vhost->protocols[n].callback) {
			if (wsi->protocol)
				lwsl_err("Failed to match protocol %s\n",
						wsi->protocol->name);
			else
				lwsl_err("No protocol on client\n");
			*cce = "ws protocol no match";
			goto bail2;
		}
	}

	lwsl_debug("Selected protocol %s\n", wsi->protocol->name);

check_extensions:
	/*
	 * stitch protocol choice into the vh protocol linked list
	 * We always insert ourselves at the start of the list
	 *
	 * X <-> B
	 * X <-> pAn <-> pB
	 */

	lws_same_vh_protocol_insert(wsi, n);

#if !defined(LWS_WITHOUT_EXTENSIONS)
	/* instantiate the accepted extensions */

	if (!lws_hdr_total_length(wsi, WSI_TOKEN_EXTENSIONS)) {
		lwsl_ext("no client extensions allowed by server\n");
		goto check_accept;
	}

	/*
	 * break down the list of server accepted extensions
	 * and go through matching them or identifying bogons
	 */

	if (lws_hdr_copy(wsi, sb, context->pt_serv_buf_size,
			 WSI_TOKEN_EXTENSIONS) < 0) {
		lwsl_warn("ext list from server failed to copy\n");
		*cce = "HS: EXT: list too big";
		goto bail2;
	}

	c = sb;
	n = 0;
	ignore = 0;
	a = NULL;
	while (more) {

		if (*c && (*c != ',' && *c != '\t')) {
			if (*c == ';') {
				ignore = 1;
				if (!a)
					a = c + 1;
			}
			if (ignore || *c == ' ') {
				c++;
				continue;
			}

			ext_name[n] = *c++;
			if (n < (int)sizeof(ext_name) - 1)
				n++;
			continue;
		}
		ext_name[n] = '\0';
		ignore = 0;
		if (!*c)
			more = 0;
		else {
			c++;
			if (!n)
				continue;
		}

		/* check we actually support it */

		lwsl_notice("checking client ext %s\n", ext_name);

		n = 0;
		ext = wsi->vhost->ws.extensions;
		while (ext && ext->callback) {
			if (strcmp(ext_name, ext->name)) {
				ext++;
				continue;
			}

			n = 1;
			lwsl_notice("instantiating client ext %s\n", ext_name);

			/* instantiate the extension on this conn */

			wsi->ws->active_extensions[wsi->ws->count_act_ext] = ext;

			/* allow him to construct his ext instance */

			if (ext->callback(lws_get_context(wsi), ext, wsi,
				   LWS_EXT_CB_CLIENT_CONSTRUCT,
				   (void *)&wsi->ws->act_ext_user[
				                        wsi->ws->count_act_ext],
				   (void *)&opts, 0)) {
				lwsl_info(" ext %s failed construction\n",
					  ext_name);
				ext++;
				continue;
			}

			/*
			 * allow the user code to override ext defaults if it
			 * wants to
			 */
			ext_name[0] = '\0';
			if (user_callback_handle_rxflow(wsi->protocol->callback,
					wsi, LWS_CALLBACK_WS_EXT_DEFAULTS,
					(char *)ext->name, ext_name,
					sizeof(ext_name))) {
				*cce = "HS: EXT: failed setting defaults";
				goto bail2;
			}

			if (ext_name[0] &&
			    lws_ext_parse_options(ext, wsi,
					          wsi->ws->act_ext_user[
						        wsi->ws->count_act_ext],
					          opts, ext_name,
						  (int)strlen(ext_name))) {
				lwsl_err("%s: unable to parse user defaults '%s'",
					 __func__, ext_name);
				*cce = "HS: EXT: failed parsing defaults";
				goto bail2;
			}

			/*
			 * give the extension the server options
			 */
			if (a && lws_ext_parse_options(ext, wsi,
					wsi->ws->act_ext_user[
					                wsi->ws->count_act_ext],
					opts, a, lws_ptr_diff(c, a))) {
				lwsl_err("%s: unable to parse remote def '%s'",
					 __func__, a);
				*cce = "HS: EXT: failed parsing options";
				goto bail2;
			}

			if (ext->callback(lws_get_context(wsi), ext, wsi,
					LWS_EXT_CB_OPTION_CONFIRM,
				      wsi->ws->act_ext_user[wsi->ws->count_act_ext],
				      NULL, 0)) {
				lwsl_err("%s: ext %s rejects server options %s",
					 __func__, ext->name, a);
				*cce = "HS: EXT: Rejects server options";
				goto bail2;
			}

			wsi->ws->count_act_ext++;

			ext++;
		}

		if (n == 0) {
			lwsl_warn("Unknown ext '%s'!\n", ext_name);
			*cce = "HS: EXT: unknown ext";
			goto bail2;
		}

		a = NULL;
		n = 0;
	}

check_accept:
#endif

	/*
	 * Confirm his accept token is the one we precomputed
	 */

	p = lws_hdr_simple_ptr(wsi, WSI_TOKEN_ACCEPT);
	if (strcmp(p, wsi->http.ah->initial_handshake_hash_base64)) {
		lwsl_warn("lws_client_int_s_hs: accept '%s' wrong vs '%s'\n", p,
				  wsi->http.ah->initial_handshake_hash_base64);
		*cce = "HS: Accept hash wrong";
		goto bail2;
	}

	/* allocate the per-connection user memory (if any) */
	if (lws_ensure_user_space(wsi)) {
		lwsl_err("Problem allocating wsi user mem\n");
		*cce = "HS: OOM";
		goto bail2;
	}

	/*
	 * we seem to be good to go, give client last chance to check
	 * headers and OK it
	 */
	if (wsi->protocol->callback(wsi,
				    LWS_CALLBACK_CLIENT_FILTER_PRE_ESTABLISH,
				    wsi->user_space, NULL, 0)) {
		*cce = "HS: Rejected by filter cb";
		goto bail2;
	}

	/* clear his proxy connection timeout */
	lws_set_timeout(wsi, NO_PENDING_TIMEOUT, 0);

	/* free up his parsing allocations */
	lws_header_table_detach(wsi, 0);

	lws_role_transition(wsi, LWSIFR_CLIENT, LRS_ESTABLISHED, &role_ops_ws);
	lws_validity_confirmed(wsi);

	wsi->rxflow_change_to = LWS_RXFLOW_ALLOW;

	/*
	 * create the frame buffer for this connection according to the
	 * size mentioned in the protocol definition.  If 0 there, then
	 * use a big default for compatibility
	 */
	n = (int)wsi->protocol->rx_buffer_size;
	if (!n)
		n = context->pt_serv_buf_size;
	n += LWS_PRE;
	wsi->ws->rx_ubuf = lws_malloc(n + 4 /* 0x0000ffff zlib */,
				"client frame buffer");
	if (!wsi->ws->rx_ubuf) {
		lwsl_err("Out of Mem allocating rx buffer %d\n", n);
		*cce = "HS: OOM";
		goto bail2;
	}
	wsi->ws->rx_ubuf_alloc = n;

	lwsl_debug("handshake OK for protocol %s\n", wsi->protocol->name);

	/* call him back to inform him he is up */

	if (wsi->protocol->callback(wsi, LWS_CALLBACK_CLIENT_ESTABLISHED,
				    wsi->user_space, NULL, 0)) {
		*cce = "HS: Rejected at CLIENT_ESTABLISHED";
		goto bail3;
	}

	return 0;

bail3:
	return 3;

bail2:
	return 2;
}